

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O3

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  word *pwVar13;
  int iVar14;
  uint uVar15;
  Vec_Wrd_t *pVVar17;
  long lVar18;
  ulong uVar19;
  int *piVar20;
  uchar *pDataC;
  ulong uVar16;
  
  pVVar4 = p->vTable;
  pVVar17 = p->vObjs;
  iVar14 = pVVar17->nSize;
  if (pVVar4->nSize < iVar14) {
    uVar19 = (ulong)(pVVar4->nSize * 2 - 1);
    while( true ) {
      do {
        uVar10 = (uint)uVar19;
        uVar15 = uVar10 + 1;
        uVar16 = (ulong)uVar15;
        uVar7 = uVar19 & 1;
        uVar19 = uVar16;
      } while (uVar7 != 0);
      if (uVar15 < 9) break;
      iVar14 = 5;
      while (uVar15 % (iVar14 - 2U) != 0) {
        uVar9 = iVar14 * iVar14;
        iVar14 = iVar14 + 2;
        if (uVar15 < uVar9) goto LAB_005690dc;
      }
    }
LAB_005690dc:
    if (pVVar4->nCap < (int)uVar15) {
      if (pVVar4->pArray == (int *)0x0) {
        piVar12 = (int *)malloc((long)(int)uVar15 << 2);
      }
      else {
        piVar12 = (int *)realloc(pVVar4->pArray,(long)(int)uVar15 << 2);
      }
      pVVar4->pArray = piVar12;
      if (piVar12 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar15;
    }
    if (uVar10 < 0x7fffffff) {
      memset(pVVar4->pArray,0xff,uVar16 << 2);
    }
    pVVar4->nSize = uVar15;
    pVVar17 = p->vObjs;
    iVar14 = pVVar17->nSize;
    if (0 < iVar14) {
      pVVar4 = p->vData;
      pVVar5 = p->vTable;
      pwVar13 = pVVar17->pArray;
      lVar18 = 0;
      do {
        uVar10 = p->nSize;
        uVar15 = (int)pwVar13[lVar18] * uVar10;
        if (((int)uVar15 < 0) || (pVVar4->nSize <= (int)uVar15)) goto LAB_005693ff;
        if ((uVar10 & 0x3fffffff) == 0) {
          uVar9 = 0;
        }
        else {
          uVar19 = 0;
          uVar9 = 0;
          do {
            lVar8 = uVar19 + (ulong)uVar15 * 4;
            uVar19 = uVar19 + 1;
            uVar9 = (*(byte *)((long)pVVar4->pArray + lVar8) + uVar9) * 0x401;
            uVar9 = uVar9 >> 6 ^ uVar9;
          } while (uVar10 << 2 != uVar19);
          uVar9 = uVar9 * 9;
        }
        uVar10 = pVVar5->nSize;
        uVar19 = (ulong)((uVar9 >> 0xb ^ uVar9) * 0x8001) % (ulong)uVar10;
        if (((int)uVar19 < 0) || ((int)uVar10 <= (int)uVar19)) goto LAB_005693ff;
        piVar12 = pVVar5->pArray;
        *(int *)((long)pwVar13 + lVar18 * 8 + 4) = piVar12[uVar19];
        piVar12[uVar19] = (int)lVar18;
        lVar18 = lVar18 + 1;
        iVar14 = pVVar17->nSize;
      } while (lVar18 < iVar14);
    }
  }
  iVar2 = p->nSize;
  uVar10 = iVar2 * iData;
  if (-1 < (int)uVar10) {
    iVar3 = p->vData->nSize;
    if ((int)uVar10 < iVar3) {
      piVar6 = p->vData->pArray;
      piVar12 = piVar6 + uVar10;
      uVar10 = p->vTable->nSize;
      if (iVar2 * 4 == 0) {
        uVar15 = 0;
      }
      else {
        uVar19 = 0;
        uVar15 = 0;
        do {
          pbVar1 = (byte *)((long)piVar12 + uVar19);
          uVar19 = uVar19 + 1;
          uVar15 = (*pbVar1 + uVar15) * 0x401;
          uVar15 = uVar15 >> 6 ^ uVar15;
        } while ((uint)(iVar2 * 4) != uVar19);
        uVar15 = uVar15 * 9;
      }
      uVar19 = (ulong)((uVar15 >> 0xb ^ uVar15) * 0x8001) % (ulong)uVar10;
      if ((-1 < (int)uVar19) && ((int)uVar19 < (int)uVar10)) {
        piVar20 = p->vTable->pArray;
        uVar10 = piVar20[uVar19];
        if (uVar10 == 0xffffffff) {
          piVar20 = piVar20 + uVar19;
        }
        else {
          do {
            if (((int)uVar10 < 0) || (iVar14 <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            if (pVVar17->pArray == (word *)0x0) {
              __assert_fail("*pPlace == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                            ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
            }
            pwVar13 = pVVar17->pArray + uVar10;
            uVar15 = (int)*pwVar13 * iVar2;
            if (((int)uVar15 < 0) || (iVar3 <= (int)uVar15)) goto LAB_005693ff;
            iVar11 = bcmp(piVar12,piVar6 + uVar15,(long)iVar2 * 4);
            if (iVar11 == 0) {
              return uVar10;
            }
            uVar10 = *(uint *)((long)pwVar13 + 4);
          } while (uVar10 != 0xffffffff);
          piVar20 = (int *)((long)pwVar13 + 4);
        }
        *piVar20 = iVar14;
        uVar10 = pVVar17->nSize;
        if (uVar10 == pVVar17->nCap) {
          if ((int)uVar10 < 0x10) {
            if (pVVar17->pArray == (word *)0x0) {
              pwVar13 = (word *)malloc(0x80);
            }
            else {
              pwVar13 = (word *)realloc(pVVar17->pArray,0x80);
            }
            pVVar17->pArray = pwVar13;
            if (pwVar13 == (word *)0x0) {
LAB_0056945c:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar17->nCap = 0x10;
          }
          else {
            if (pVVar17->pArray == (word *)0x0) {
              pwVar13 = (word *)malloc((ulong)uVar10 << 4);
            }
            else {
              pwVar13 = (word *)realloc(pVVar17->pArray,(ulong)uVar10 << 4);
            }
            pVVar17->pArray = pwVar13;
            if (pwVar13 == (word *)0x0) goto LAB_0056945c;
            pVVar17->nCap = uVar10 * 2;
          }
        }
        else {
          pwVar13 = pVVar17->pArray;
        }
        iVar14 = pVVar17->nSize;
        pVVar17->nSize = iVar14 + 1;
        pwVar13[iVar14] = (ulong)(uint)iData | 0xffffffff00000000;
        return p->vObjs->nSize + -1;
      }
    }
  }
LAB_005693ff:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, Hsh_IntObj(p, i)->iData), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}